

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

bool __thiscall
ON_SubDComponentRef::GetBBox(ON_SubDComponentRef *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_SubDComponentLocation OVar1;
  Type TVar2;
  bool bVar3;
  ON_SubDFace *this_00;
  undefined1 local_140 [8];
  ON_BoundingBox bbox1;
  ON_SubDFace *face;
  ON_SubDEdge *local_a8;
  ON_SubDEdge *edge;
  ON_SubDVertex *local_70;
  ON_SubDVertex *vertex;
  ON_BoundingBox bbox;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_SubDComponentRef *this_local;
  
  if ((boxmin == (double *)0x0) || (boxmax == (double *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    bbox.m_max.x = ON_BoundingBox::EmptyBoundingBox.m_max.y;
    bbox.m_max.y = ON_BoundingBox::EmptyBoundingBox.m_max.z;
    bbox.m_min.y = ON_BoundingBox::EmptyBoundingBox.m_min.z;
    bbox.m_min.z = ON_BoundingBox::EmptyBoundingBox.m_max.x;
    vertex = (ON_SubDVertex *)ON_BoundingBox::EmptyBoundingBox.m_min.x;
    bbox.m_min.x = ON_BoundingBox::EmptyBoundingBox.m_min.y;
    TVar2 = ON_SubDComponentPtr::ComponentType(&this->m_component_ptr);
    switch(TVar2) {
    case Unset:
      break;
    case Vertex:
      local_70 = ON_SubDComponentPtr::Vertex(&this->m_component_ptr);
      if (((local_70 != (ON_SubDVertex *)0x0) &&
          (OVar1 = this->m_component_location, OVar1 != Unset)) &&
         (OVar1 == ControlNet || OVar1 == Surface)) {
        ON_SubDVertex::ControlNetBoundingBox((ON_BoundingBox *)&edge,local_70);
        memcpy(&vertex,&edge,0x30);
      }
      break;
    case Edge:
      local_a8 = ON_SubDComponentPtr::Edge(&this->m_component_ptr);
      if (((local_a8 != (ON_SubDEdge *)0x0) && (OVar1 = this->m_component_location, OVar1 != Unset))
         && (OVar1 == ControlNet || OVar1 == Surface)) {
        ON_SubDEdge::ControlNetBoundingBox((ON_BoundingBox *)&face,local_a8);
        memcpy(&vertex,&face,0x30);
      }
      break;
    case Face:
      this_00 = ON_SubDComponentPtr::Face(&this->m_component_ptr);
      if (((this_00 != (ON_SubDFace *)0x0) && (OVar1 = this->m_component_location, OVar1 != Unset))
         && (OVar1 == ControlNet || OVar1 == Surface)) {
        ON_SubDFace::ControlNetBoundingBox((ON_BoundingBox *)&bbox1.m_max.z,this_00);
        memcpy(&vertex,&bbox1.m_max.z,0x30);
      }
    }
    if (bGrowBox) {
      ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_140);
      ON_3dPoint::operator=((ON_3dPoint *)local_140,boxmin);
      ON_3dPoint::operator=((ON_3dPoint *)&bbox1.m_min.z,boxmax);
      bVar3 = ON_BoundingBox::IsValid((ON_BoundingBox *)local_140);
      if (bVar3) {
        ON_BoundingBox::Union((ON_BoundingBox *)&vertex,(ON_BoundingBox *)local_140);
      }
    }
    *boxmin = (double)vertex;
    boxmin[1] = bbox.m_min.x;
    boxmin[2] = bbox.m_min.y;
    *boxmax = bbox.m_min.z;
    boxmax[1] = bbox.m_max.x;
    boxmax[2] = bbox.m_max.y;
    this_local._7_1_ = ON_BoundingBox::IsValid((ON_BoundingBox *)&vertex);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDComponentRef::GetBBox(
  double* boxmin,
  double* boxmax,
  bool bGrowBox
  ) const
{
  if ( nullptr == boxmin || nullptr == boxmax )
    return false;

  ON_BoundingBox bbox = ON_BoundingBox::EmptyBoundingBox;

  switch (m_component_ptr.ComponentType())
  {
      case ON_SubDComponentPtr::Type::Unset:
        break;
      
      case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = m_component_ptr.Vertex();
      if ( nullptr == vertex )
        break;
      switch (m_component_location)
      {
      case ON_SubDComponentLocation::Surface:
        // public opennurbs does not provide limit mesh tools.
      case ON_SubDComponentLocation::ControlNet:
        bbox = vertex->ControlNetBoundingBox();
        break;
              
      case ON_SubDComponentLocation::Unset:
        break;
      }
    }
    break;
  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* edge = m_component_ptr.Edge();
      if ( nullptr == edge )
        break;
      switch (m_component_location)
      {
      case ON_SubDComponentLocation::Surface:
        // public opennurbs does not provide limit mesh tools.
      case ON_SubDComponentLocation::ControlNet:
        bbox = edge->ControlNetBoundingBox();
        break;
      case ON_SubDComponentLocation::Unset:
        break;
      }
    }
    break;
  case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFace* face = m_component_ptr.Face();
      if ( nullptr == face )
        break;
      switch (m_component_location)
      {
      case ON_SubDComponentLocation::Surface:
        // public opennurbs does not provide limit mesh tools.
      case ON_SubDComponentLocation::ControlNet:
        bbox = face->ControlNetBoundingBox();
        break;
      case ON_SubDComponentLocation::Unset:
        break;
      }
    }
    break;
  }

  if (bGrowBox)
  {
    ON_BoundingBox bbox1;
    bbox1.m_min = boxmin;
    bbox1.m_max = boxmax;
    if (bbox1.IsValid())
      bbox.Union(bbox1);
  }

  boxmin[0] = bbox.m_min.x;
  boxmin[1] = bbox.m_min.y;
  boxmin[2] = bbox.m_min.z;

  boxmax[0] = bbox.m_max.x;
  boxmax[1] = bbox.m_max.y;
  boxmax[2] = bbox.m_max.z;

  return bbox.IsValid();
}